

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall mario::EventLoop::EventLoop(EventLoop *this)

{
  int iVar1;
  pid_t pVar2;
  Channel *this_00;
  EPoller *this_01;
  TimerQueue *this_02;
  Writer *pWVar3;
  pointer pCVar4;
  long *in_FS_OFFSET;
  EventLoop *local_168;
  code *local_160;
  undefined8 local_158;
  type local_150;
  ReadEventCallback local_138;
  Writer local_118;
  EventLoop *local_a0;
  Writer local_98;
  EventLoop *local_10;
  EventLoop *this_local;
  
  this->_callingPendingFunctors = false;
  local_10 = this;
  iVar1 = createEventfd();
  this->_wakeupFd = iVar1;
  this_00 = (Channel *)operator_new(0xa0);
  Channel::Channel(this_00,this,this->_wakeupFd);
  std::unique_ptr<mario::Channel,std::default_delete<mario::Channel>>::
  unique_ptr<std::default_delete<mario::Channel>,void>
            ((unique_ptr<mario::Channel,std::default_delete<mario::Channel>> *)&this->_wakeupChannel
             ,this_00);
  MutexLock::MutexLock(&this->_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (&this->_pendingFunctors);
  this->_looping = false;
  pVar2 = CurrentThread::tid();
  this->_threadId = pVar2;
  Timestamp::Timestamp(&this->_pollReturnTime);
  this_01 = (EPoller *)operator_new(0x58);
  EPoller::EPoller(this_01,this);
  std::unique_ptr<mario::EPoller,std::default_delete<mario::EPoller>>::
  unique_ptr<std::default_delete<mario::EPoller>,void>
            ((unique_ptr<mario::EPoller,std::default_delete<mario::EPoller>> *)&this->_poller,
             this_01);
  this_02 = (TimerQueue *)operator_new(0x148);
  TimerQueue::TimerQueue(this_02,this);
  std::unique_ptr<mario::TimerQueue,std::default_delete<mario::TimerQueue>>::
  unique_ptr<std::default_delete<mario::TimerQueue>,void>
            ((unique_ptr<mario::TimerQueue,std::default_delete<mario::TimerQueue>> *)
             &this->_timerQueue,this_02);
  std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>::vector(&this->_activeChannels);
  el::base::Writer::Writer
            (&local_98,Info,
             "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
             ,0x27,"mario::EventLoop::EventLoop()",NormalLog,0);
  pWVar3 = el::base::Writer::construct(&local_98,1,el::base::consts::kDefaultLoggerId);
  pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [18])"EventLoop created");
  local_a0 = this;
  pWVar3 = el::base::Writer::operator<<(pWVar3,&local_a0);
  pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [12])" in thread ");
  el::base::Writer::operator<<(pWVar3,&this->_threadId);
  el::base::Writer::~Writer(&local_98);
  if (*(long *)(*in_FS_OFFSET + -0x10) == 0) {
    *(EventLoop **)(*in_FS_OFFSET + -0x10) = this;
  }
  else {
    el::base::Writer::Writer
              (&local_118,Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
               ,0x29,"mario::EventLoop::EventLoop()",NormalLog,0);
    pWVar3 = el::base::Writer::construct(&local_118,1,el::base::consts::kDefaultLoggerId);
    pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [19])"Another EventLoop ");
    pWVar3 = el::base::Writer::operator<<(pWVar3,(EventLoop **)(*in_FS_OFFSET + -0x10));
    pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [24])" exists in this thread ");
    el::base::Writer::operator<<(pWVar3,&this->_threadId);
    el::base::Writer::~Writer(&local_118);
  }
  pCVar4 = std::unique_ptr<mario::Channel,_std::default_delete<mario::Channel>_>::operator->
                     (&this->_wakeupChannel);
  local_160 = handleRead;
  local_158 = 0;
  local_168 = this;
  std::bind<void(mario::EventLoop::*)(),mario::EventLoop*>
            (&local_150,(offset_in_EventLoop_to_subr *)&local_160,&local_168);
  std::function<void(mario::Timestamp)>::
  function<std::_Bind<void(mario::EventLoop::*(mario::EventLoop*))()>,void>
            ((function<void(mario::Timestamp)> *)&local_138,&local_150);
  Channel::setReadCallback(pCVar4,&local_138);
  std::function<void_(mario::Timestamp)>::~function(&local_138);
  pCVar4 = std::unique_ptr<mario::Channel,_std::default_delete<mario::Channel>_>::operator->
                     (&this->_wakeupChannel);
  Channel::enableReading(pCVar4);
  return;
}

Assistant:

EventLoop::EventLoop() 
	: _looping(false)
    , _poller(new EPoller(this))
    , _timerQueue(new TimerQueue(this))
	, _threadId(CurrentThread::tid()) 
    , _callingPendingFunctors(false)
    , _wakeupFd(createEventfd())
    , _wakeupChannel(new Channel(this, _wakeupFd))
{

	LOG(INFO) << "EventLoop created" << this << " in thread " << _threadId;
	if (t_loopInThisThread) {
		LOG(FATAL) << "Another EventLoop " << t_loopInThisThread
				  << " exists in this thread " << _threadId;
	} else {
		t_loopInThisThread = this;
	}

    _wakeupChannel -> setReadCallback(
            std::bind(&EventLoop::handleRead, this)
        );
    _wakeupChannel -> enableReading();
}